

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O0

int SUNLinSolSpace(SUNLinearSolver S,long *lenrwLS,long *leniwLS)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 0x60) == 0) {
    *in_RSI = 0;
    *in_RDX = 0;
    local_4 = 0;
  }
  else {
    local_4 = (**(code **)(*(long *)(in_RDI + 8) + 0x60))(in_RDI,in_RSI,in_RDX);
  }
  return local_4;
}

Assistant:

int SUNLinSolSpace(SUNLinearSolver S, long int *lenrwLS,
                   long int *leniwLS)
{
  if (S->ops->space)
    return ((int) S->ops->space(S, lenrwLS, leniwLS));
  else {
    *lenrwLS = 0;
    *leniwLS = 0;
    return SUNLS_SUCCESS;
  }
}